

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
::New(MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
      *this,Arena *arena)

{
  MessageLite *pMVar1;
  
  if (arena == (Arena *)0x0) {
    pMVar1 = (MessageLite *)operator_new(0x30);
    arena = (Arena *)0x0;
  }
  else {
    pMVar1 = (MessageLite *)
             Arena::AllocateAligned
                       (arena,(type_info *)
                              &MapEntryLite<std::__cxx11::string,double,(google::protobuf::internal::WireFormatLite::FieldType)9,(google::protobuf::internal::WireFormatLite::FieldType)1,0>
                               ::typeinfo,0x30);
  }
  pMVar1[1]._vptr_MessageLite = (_func_int **)0x0;
  pMVar1[4]._vptr_MessageLite = (_func_int **)arena;
  pMVar1[2]._vptr_MessageLite = (_func_int **)&fixed_address_empty_string_abi_cxx11_;
  pMVar1[3]._vptr_MessageLite = (_func_int **)0x0;
  *(undefined4 *)&pMVar1[5]._vptr_MessageLite = 0;
  pMVar1->_vptr_MessageLite = (_func_int **)&PTR__MapEntryImpl_003b7b90;
  pMVar1[1]._vptr_MessageLite = (_func_int **)this->default_instance_;
  return pMVar1;
}

Assistant:

Base* New(Arena* arena) const {
    Derived* entry = Arena::CreateMessage<Derived>(arena);
    entry->default_instance_ = default_instance_;
    return entry;
  }